

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotShaded<double>
               (char *label_id,double *values,int count,double y_ref,double xscale,double x0,
               int offset,int stride)

{
  undefined1 local_d0 [8];
  GetterYRef getter2;
  GetterYs<double> getter1;
  double local_70;
  ImPlotLimits local_68;
  byte local_41;
  int local_40;
  int iStack_3c;
  bool fit2;
  int stride_local;
  int offset_local;
  double x0_local;
  double xscale_local;
  double y_ref_local;
  double *pdStack_18;
  int count_local;
  double *values_local;
  char *label_id_local;
  
  local_41 = 1;
  local_40 = stride;
  iStack_3c = offset;
  _stride_local = x0;
  x0_local = xscale;
  xscale_local = y_ref;
  y_ref_local._4_4_ = count;
  pdStack_18 = values;
  values_local = (double *)label_id;
  if ((y_ref == -INFINITY) && (!NAN(y_ref))) {
    local_41 = 0;
    GetPlotLimits(&local_68,-1);
    xscale_local = local_68.Y.Min;
  }
  if ((xscale_local == INFINITY) && (!NAN(xscale_local))) {
    local_41 = 0;
    GetPlotLimits((ImPlotLimits *)&getter1.Offset,-1);
    xscale_local = local_70;
  }
  GetterYs<double>::GetterYs
            ((GetterYs<double> *)&getter2.X0,pdStack_18,y_ref_local._4_4_,x0_local,_stride_local,
             iStack_3c,local_40);
  GetterYRef::GetterYRef
            ((GetterYRef *)local_d0,xscale_local,y_ref_local._4_4_,x0_local,_stride_local);
  PlotShadedEx<ImPlot::GetterYs<double>,ImPlot::GetterYRef>
            ((char *)values_local,(GetterYs<double> *)&getter2.X0,(GetterYRef *)local_d0,
             (bool)(local_41 & 1));
  return;
}

Assistant:

void PlotShaded(const char* label_id, const T* values, int count, double y_ref, double xscale, double x0, int offset, int stride) {
    bool fit2 = true;
    if (y_ref == -HUGE_VAL) {
        fit2 = false;
        y_ref = GetPlotLimits().Y.Min;
    }
    if (y_ref == HUGE_VAL) {
        fit2 = false;
        y_ref = GetPlotLimits().Y.Max;
    }
    GetterYs<T> getter1(values,count,xscale,x0,offset,stride);
    GetterYRef getter2(y_ref,count,xscale,x0);
    PlotShadedEx(label_id, getter1, getter2, fit2);
}